

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

Status __thiscall kwssys::Directory::Load(Directory *this,string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *pcVar3;
  Status SVar4;
  int __errnum;
  allocator local_49;
  string local_48 [32];
  
  Clear(this);
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    if (errorMessage == (string *)0x0) goto LAB_0014a9a2;
    __errnum = *piVar1;
  }
  else {
    *piVar1 = 0;
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      std::
      vector<kwssys::DirectoryInternals::FileData,std::allocator<kwssys::DirectoryInternals::FileData>>
      ::emplace_back<char(&)[256]>
                ((vector<kwssys::DirectoryInternals::FileData,std::allocator<kwssys::DirectoryInternals::FileData>>
                  *)this->Internal,&pdVar2->d_name);
    }
    __errnum = *piVar1;
    if (__errnum == 0) {
      std::__cxx11::string::_M_assign((string *)&this->Internal->Path);
      closedir(__dirp);
      SVar4.Kind_ = Success;
      SVar4.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      return SVar4;
    }
    if (errorMessage == (string *)0x0) goto LAB_0014a9a2;
  }
  pcVar3 = strerror(__errnum);
  std::__cxx11::string::string(local_48,pcVar3,&local_49);
  std::__cxx11::string::operator=((string *)errorMessage,local_48);
  std::__cxx11::string::~string(local_48);
LAB_0014a9a2:
  SVar4 = Status::POSIX_errno();
  return SVar4;
}

Assistant:

Status Directory::Load(std::string const& name, std::string* errorMessage)
{
  this->Clear();

  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  errno = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.emplace_back(d->d_name);
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  this->Internal->Path = name;
  closedir(dir);
  return Status::Success();
}